

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polytri-cli.cc
# Opt level: O0

int main(int argc,char **argv)

{
  pointer *ppvVar1;
  int iVar2;
  ostream *poVar3;
  size_type num_contours;
  uint *nvertices_per_contour;
  vector_t *vertices_00;
  undefined1 local_70 [8];
  TriangleBuffer_t triangles;
  undefined1 local_48 [8];
  vector<vector_t,_std::allocator<vector_t>_> vertices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> contour_lengths;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"usage : ");
    poVar3 = std::operator<<(poVar3,*argv);
    poVar3 = std::operator<<(poVar3," filename.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  else {
    ppvVar1 = &vertices.super__Vector_base<vector_t,_std::allocator<vector_t>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppvVar1);
    std::vector<vector_t,_std::allocator<vector_t>_>::vector
              ((vector<vector_t,_std::allocator<vector_t>_> *)local_48);
    iVar2 = anon_unknown.dwarf_3c08::LoadSegments
                      (argv[1],(vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppvVar1,
                       (vector<vector_t,_std::allocator<vector_t>_> *)local_48);
    if (iVar2 == 0) {
      std::vector<triangle_t,_std::allocator<triangle_t>_>::vector
                ((vector<triangle_t,_std::allocator<triangle_t>_> *)local_70);
      ppvVar1 = &vertices.super__Vector_base<vector_t,_std::allocator<vector_t>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      num_contours = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppvVar1);
      nvertices_per_contour =
           std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppvVar1);
      vertices_00 = std::vector<vector_t,_std::allocator<vector_t>_>::data
                              ((vector<vector_t,_std::allocator<vector_t>_> *)local_48);
      PolygonTriangulation::Triangulate
                (num_contours,nvertices_per_contour,vertices_00,
                 (vector<triangle_t,_std::allocator<triangle_t>_> *)local_70);
      anon_unknown.dwarf_3c08::ExportData
                ((TriangleBuffer_t *)local_70,
                 (vector<vector_t,_std::allocator<vector_t>_> *)local_48);
      triangles.super__Vector_base<triangle_t,_std::allocator<triangle_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      std::vector<triangle_t,_std::allocator<triangle_t>_>::~vector
                ((vector<triangle_t,_std::allocator<triangle_t>_> *)local_70);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"error while reading the data file.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      triangles.super__Vector_base<triangle_t,_std::allocator<triangle_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
    argv_local._4_4_ = (uint)(iVar2 != 0);
    std::vector<vector_t,_std::allocator<vector_t>_>::~vector
              ((vector<vector_t,_std::allocator<vector_t>_> *)local_48);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &vertices.super__Vector_base<vector_t,_std::allocator<vector_t>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
  if (argc < 2) {
    std::cerr << "usage : " << argv[0] << " filename." << std::endl;
    return EXIT_FAILURE;
  }

  std::vector<uint32_t> contour_lengths;
  std::vector<vertex_t> vertices;
  if (LoadSegments(argv[1u], contour_lengths, vertices)) {
    std::cerr << "error while reading the data file." << std::endl;
    return EXIT_FAILURE;
  }

  PolygonTriangulation::TriangleBuffer_t triangles;
  PolygonTriangulation::Triangulate(
    contour_lengths.size(),
    contour_lengths.data(),
    vertices.data(),
    triangles
  );

  ExportData(triangles, vertices);

  return EXIT_SUCCESS;
}